

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O1

void __thiscall mjs::value_representation::value_representation(value_representation *this,value *v)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  wostringstream woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  uVar1 = (ulong)v->type_;
  switch(uVar1) {
  case 0:
  case 1:
    uVar2 = uVar1 << 0x30;
    goto LAB_00175788;
  case 2:
    uVar2 = (ulong)(v->field_1).b_;
    break;
  case 3:
    dVar3 = (v->field_1).n_;
    if (NAN(dVar3)) {
      dVar3 = NAN;
    }
    goto LAB_001757a2;
  case 4:
  case 5:
    uVar2 = (ulong)*(uint *)((long)&v->field_1 + 8);
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_188);
    std::operator<<((wostream *)local_188,"Not handled: ");
    debug_print((wostream *)local_188,v,2,0x7fffffff,0);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                        ,0x38);
  }
  uVar2 = uVar1 << 0x30 | uVar2;
LAB_00175788:
  dVar3 = (double)(uVar2 + 0x1000000000000 | 0x7ff0000000000000);
LAB_001757a2:
  this->repr_ = (uint64_t)dVar3;
  return;
}

Assistant:

value_representation::value_representation(const value& v) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:      repr_ = make_repr(v.type(), 0); return;
    case value_type::boolean:   repr_ = make_repr(v.type(), v.boolean_value()); return;
    case value_type::number:    repr_ = number_repr(v.number_value()); return;
    case value_type::string:    repr_ = make_repr(v.type(), v.string_value().unsafe_raw_get().pos_); return;
    case value_type::object:    repr_ = make_repr(v.type(), v.object_value().pos_); return;
    case value_type::reference: break; // Not legal here
    }
    std::wostringstream woss;
    woss << "Not handled: ";
    debug_print(woss, v, 2);
    THROW_RUNTIME_ERROR(woss.str());
}